

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O2

Vec_Int_t * Bmc_ManBCoreCollect(Gia_Man_t *p,int iFrame,int iOut,sat_solver *pSat)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  sat_solver *psVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  uint uVar12;
  uint uVar13;
  Vec_Int_t *p_03;
  Gia_Man_t *pGVar14;
  uint local_7c;
  uint local_78;
  uint local_74;
  int local_70;
  int local_6c;
  Vec_Int_t *local_68;
  sat_solver *local_60;
  int local_54;
  int local_50;
  int local_4c;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  pGVar14 = p;
  local_60 = pSat;
  p_00 = Vec_IntAlloc((int)p);
  iVar7 = (int)pGVar14;
  p_01 = Vec_IntAlloc(iVar7);
  p_02 = Vec_IntAlloc(iVar7);
  if ((iOut | iFrame) < 0) {
    __assert_fail("iFrame >= 0 && iOut >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                  ,0x7c,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
  }
  Vec_IntPush(p_00,-1);
  Vec_IntPush(p_00,-1);
  pGVar10 = Gia_ManPo(p,iOut);
  Bmc_ManBCoreAssignVar(p,pGVar10,iFrame,p_00);
  local_54 = iOut;
  pGVar10 = Gia_ManPo(p,iOut);
  iVar7 = Gia_ObjId(p,pGVar10);
  Vec_IntPush(p_01,iVar7);
  local_50 = iFrame;
  local_48 = p;
  local_40 = p_00;
  while (pGVar14 = local_48, local_68 = p_01, -1 < iFrame) {
    local_70 = iFrame;
    Gia_ManIncrementTravId(p);
    pGVar10 = p->pObjs;
    iVar7 = Gia_ObjId(p,pGVar10);
    if (p->nTravIdsAlloc <= iVar7) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar7 = p->nTravIds;
    piVar4 = p->pTravIds;
    iVar8 = Gia_ObjId(p,pGVar10);
    piVar4[iVar8] = iVar7;
    Bmc_ManBCoreAssignVar(p,p->pObjs,local_70,p_00);
    psVar6 = local_60;
    uVar13 = p->pObjs->Value;
    if ((int)uVar13 < 0) {
      __assert_fail("iVar >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x15f,"int sat_solver_add_const(sat_solver *, int, int)");
    }
    local_7c = uVar13 * 2 + 1;
    iVar7 = sat_solver_addclause(local_60,(lit *)&local_7c,(lit *)&local_78);
    p_03 = local_68;
    if (iVar7 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x163,"int sat_solver_add_const(sat_solver *, int, int)");
    }
    p_02->nSize = 0;
    local_6c = p_00->nSize;
    for (iVar7 = 0; iVar7 < p_03->nSize; iVar7 = iVar7 + 1) {
      iVar8 = Vec_IntEntry(p_03,iVar7);
      pGVar10 = Gia_ManObj(p,iVar8);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      iVar8 = Gia_ObjFaninId0p(p,pGVar10);
      Bmc_ManBCoreCollect_rec(p,iVar8,local_70,p_00,p_02);
    }
    local_38 = p_02;
    if (local_70 == local_50) {
      pGVar10 = Gia_ManPo(p,local_54);
      if (pGVar10->Value != 1) {
        __assert_fail("pObj->Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                      ,0x94,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
      }
      if (pGVar10[-(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)].Value != 3) {
        __assert_fail("Gia_ObjFanin0(pObj)->Value == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                      ,0x95,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
      }
      sat_solver_add_constraint(psVar6,3,1,(uint)*(undefined8 *)pGVar10 >> 0x1d & 1);
      p_01 = p_02;
    }
    else {
      for (iVar7 = 0; p_01 = local_38, iVar7 < p_03->nSize; iVar7 = iVar7 + 1) {
        iVar8 = Vec_IntEntry(p_03,iVar7);
        pGVar10 = Gia_ManObj(p,iVar8);
        psVar6 = local_60;
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        if ((int)(pGVar10[-(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)].Value |
                 pGVar10->Value) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
        }
        uVar1 = pGVar10->Value * 2;
        uVar13 = ((uint)*(undefined8 *)pGVar10 >> 0x1d & 1) +
                 pGVar10[-(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)].Value * 2;
        local_78 = uVar13 ^ 1;
        local_7c = uVar1;
        iVar8 = sat_solver_addclause(local_60,(lit *)&local_7c,(lit *)&local_74);
        if (iVar8 != 0) {
          local_7c = uVar1 | 1;
          local_78 = uVar13;
          sat_solver_addclause(psVar6,(lit *)&local_7c,(lit *)&local_74);
        }
        p_03 = local_68;
        p_00 = local_40;
      }
    }
    for (iVar7 = 0; iVar7 < p_01->nSize; iVar7 = iVar7 + 1) {
      iVar8 = Vec_IntEntry(p_01,iVar7);
      pGVar10 = Gia_ManObj(p,iVar8);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ObjRiToRo(p,pGVar10);
      pGVar10->Value = pGVar11->Value;
    }
    iVar7 = p_00->nSize;
    local_4c = iVar7;
    for (iVar8 = local_6c; iVar8 < iVar7; iVar8 = iVar8 + 2) {
      iVar9 = Vec_IntEntry(p_00,iVar8);
      pGVar10 = Gia_ManObj(p,iVar9);
      psVar6 = local_60;
      uVar5 = *(ulong *)pGVar10;
      uVar13 = (uint)uVar5;
      if ((~uVar13 & 0x9fffffff) != 0) {
        if (((int)uVar13 < 0) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                        ,0xa7,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)")
          ;
        }
        uVar2 = pGVar10->Value;
        uVar12 = (uint)(uVar5 >> 0x20);
        uVar3 = pGVar10[-(ulong)(uVar12 & 0x1fffffff)].Value;
        uVar1 = uVar2 * 2 + 1;
        uVar13 = ((uint)(uVar5 >> 0x1d) & 1) + pGVar10[-(ulong)(uVar13 & 0x1fffffff)].Value * 2;
        local_7c = uVar1;
        local_78 = uVar13;
        local_6c = iVar8;
        iVar7 = sat_solver_addclause(local_60,(lit *)&local_7c,(lit *)&local_74);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x196,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        uVar3 = (uVar12 >> 0x1d & 1) + uVar3 * 2;
        local_7c = uVar1;
        local_78 = uVar3;
        iVar7 = sat_solver_addclause(psVar6,(lit *)&local_7c,(lit *)&local_74);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x19b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        local_7c = uVar2 * 2;
        local_78 = uVar13 ^ 1;
        local_74 = uVar3 ^ 1;
        iVar9 = sat_solver_addclause(psVar6,(lit *)&local_7c,&local_70);
        p_01 = local_38;
        p = local_48;
        p_00 = local_40;
        iVar7 = local_4c;
        iVar8 = local_6c;
        if (iVar9 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x1a1,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
      }
    }
    p_02 = local_68;
    iFrame = local_70 + -1;
  }
  for (iVar7 = 0; iVar7 < p_01->nSize; iVar7 = iVar7 + 1) {
    iVar8 = Vec_IntEntry(p_01,iVar7);
    pGVar10 = Gia_ManObj(pGVar14,iVar8);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    uVar13 = pGVar10->Value;
    iVar8 = Abc_Lit2Var(p_00->nSize);
    p_01 = local_68;
    sat_solver_add_constraint(local_60,uVar13,iVar8,1);
    pGVar10 = Gia_ObjRiToRo(pGVar14,pGVar10);
    Bmc_ManBCoreAssignVar(pGVar14,pGVar10,-1,p_00);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return p_00;
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollect( Gia_Man_t * p, int iFrame, int iOut, sat_solver * pSat )
{
    Gia_Obj_t * pObj; 
    int f, i, iObj, nNodesOld;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots2 = Vec_IntAlloc( 100 );
    assert( iFrame >= 0 && iOut >= 0 );
    // add first variables
    Vec_IntPush( vNodes, -1 );
    Vec_IntPush( vNodes, -1 );
    Bmc_ManBCoreAssignVar( p, Gia_ManPo(p, iOut), iFrame, vNodes );
    // start with root node
    Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, iOut)) );
    // iterate through time frames
    for ( f = iFrame; f >= 0; f-- )
    {
        Gia_ManIncrementTravId( p );
        // add constant node
        Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
        Bmc_ManBCoreAssignVar( p, Gia_ManConst0(p), f, vNodes );
        sat_solver_add_const( pSat, Gia_ManConst0(p)->Value, 1 );
        // collect nodes in this timeframe
        Vec_IntClear( vRoots2 );
        nNodesOld = Vec_IntSize(vNodes);
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
            Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRoots2 );
        if ( f == iFrame )
        {
            // add the final clause
            pObj = Gia_ManPo(p, iOut);
            assert( pObj->Value == 1 );
            assert( Gia_ObjFanin0(pObj)->Value == 3 );
//            sat_solver_add_const( pSat, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            sat_solver_add_constraint( pSat, Gia_ObjFanin0(pObj)->Value, pObj->Value, Gia_ObjFaninC0(pObj) );
        }
        else
        {
            // connect current RIs to previous ROs
            Gia_ManForEachObjVec( vRoots, p, pObj, i )
                sat_solver_add_buffer( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        }
        Gia_ManForEachObjVec( vRoots2, p, pObj, i )
            pObj->Value = Gia_ObjRiToRo(p, pObj)->Value;
        // add nodes of this timeframe
        Vec_IntForEachEntryStart( vNodes, iObj, i, nNodesOld )
        {
            pObj = Gia_ManObj(p, iObj); i++;
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) );
            sat_solver_add_and( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 );
        }
        // collect constant node
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    // add constraint variables for the init state
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
    {
        sat_solver_add_constraint( pSat, pObj->Value, Abc_Lit2Var(Vec_IntSize(vNodes)), 1 );
        pObj = Gia_ObjRiToRo(p, pObj);
        Bmc_ManBCoreAssignVar( p, pObj, -1, vNodes );
    }
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    return vNodes;
}